

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CodeChangeCount(Vdbe *v,int regCounter,char *zColName)

{
  sqlite3VdbeAddOp0(v,0x53);
  sqlite3VdbeAddOp2(v,0x54,regCounter,1);
  sqlite3VdbeSetNumCols(v,1);
  sqlite3VdbeSetColName(v,0,0,zColName,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeChangeCount(Vdbe *v, int regCounter, const char *zColName){
  sqlite3VdbeAddOp0(v, OP_FkCheck);
  sqlite3VdbeAddOp2(v, OP_ResultRow, regCounter, 1);
  sqlite3VdbeSetNumCols(v, 1);
  sqlite3VdbeSetColName(v, 0, COLNAME_NAME, zColName, SQLITE_STATIC);
}